

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_CutAreaDerefed2(Of_Man_t *p,int *pCut)

{
  int iVar1;
  int iVar2;
  int local_20;
  int iObj;
  int i;
  int Ela1;
  int *pCut_local;
  Of_Man_t *p_local;
  
  iVar1 = Vec_IntSize(&p->vCutRefs);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntSize(&p->vCutRefs) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0x440,"int Of_CutAreaDerefed2(Of_Man_t *, int *)");
  }
  iVar1 = Of_CutRef2_rec(p,pCut);
  for (local_20 = 0; iVar2 = Vec_IntSize(&p->vCutRefs), local_20 < iVar2; local_20 = local_20 + 1) {
    iVar2 = Vec_IntEntry(&p->vCutRefs,local_20);
    Of_ObjRefDec(p,iVar2);
  }
  Vec_IntClear(&p->vCutRefs);
  return iVar1;
}

Assistant:

static inline int Of_CutAreaDerefed2( Of_Man_t * p, int * pCut )
{
    int Ela1, i, iObj;
    assert( Vec_IntSize(&p->vCutRefs) == 0 );
    Ela1 = Of_CutRef2_rec( p, pCut );
    Vec_IntForEachEntry( &p->vCutRefs, iObj, i )
        Of_ObjRefDec(p, iObj);
    Vec_IntClear( &p->vCutRefs );
    return Ela1;
}